

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.h
# Opt level: O2

reverse_iterator __thiscall JSONNode::rend(JSONNode *this)

{
  JSONNode **ppJVar1;
  JSONNode *in_RSI;
  
  makeUniqueInternal(in_RSI);
  ppJVar1 = internalJSONNode::begin(in_RSI->internal);
  this->internal = (internalJSONNode *)(ppJVar1 + -1);
  return (reverse_iterator)(JSONNode **)this;
}

Assistant:

inline JSONNode::reverse_iterator JSONNode::rend(void) json_nothrow {
		  JSON_CHECK_INTERNAL();
		  JSON_ASSERT(type() == JSON_NODE || type() == JSON_ARRAY, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("rend"));
		  makeUniqueInternal();
		  return JSONNode::reverse_iterator(internal -> begin() - 1);
	   }